

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  Finder *pFVar1;
  long lVar2;
  OneofDescriptor *oneof_descriptor;
  _Alloc_hider __n;
  ParserImpl *pPVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  CppType CVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ExtensionRange *pEVar9;
  undefined4 extraout_var_02;
  FieldDescriptor *pFVar10;
  undefined4 extraout_var_03;
  Descriptor *pDVar11;
  long *plVar12;
  ReservedRange *pRVar13;
  FieldDescriptor *pFVar14;
  undefined8 *puVar15;
  MessageFactory *factory;
  LogMessage *other;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  MessageLite *this_00;
  size_type *psVar17;
  Reflection *this_01;
  pointer pcVar18;
  size_type *psVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  FieldDescriptor *local_138;
  FieldDescriptor *any_type_url_field;
  FieldDescriptor *any_value_field;
  undefined1 local_120 [8];
  int32 field_number;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  undefined1 local_100 [8];
  string field_name;
  undefined8 local_d0;
  undefined8 uStack_c8;
  ParserImpl *local_c0;
  undefined1 local_b8 [8];
  string prefix;
  string serialized_value;
  undefined1 local_68 [8];
  string full_type_name;
  undefined4 extraout_var_04;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
  iVar7 = (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
  serialized_value.field_2._8_8_ = CONCAT44(extraout_var,iVar7);
  local_100 = (undefined1  [8])&field_name._M_string_length;
  field_name._M_dataplus._M_p = (pointer)0x0;
  field_name._M_string_length._0_1_ = 0;
  any_value_field = *(FieldDescriptor **)&(this->tokenizer_).current_.line;
  bVar5 = internal::GetAnyFieldDescriptors(message,&local_138,&any_type_url_field);
  psVar19 = &full_type_name._M_string_length;
  if (bVar5) {
    local_68 = (undefined1  [8])psVar19;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"[","");
    bVar5 = TryConsume(this,(string *)local_68);
    if (local_68 != (undefined1  [8])psVar19) {
      operator_delete((void *)local_68);
    }
    if (bVar5) {
      full_type_name._M_dataplus._M_p = (pointer)0x0;
      full_type_name._M_string_length = full_type_name._M_string_length & 0xffffffffffffff00;
      prefix._M_dataplus._M_p = (pointer)0x0;
      prefix._M_string_length._0_1_ = 0;
      local_b8 = (undefined1  [8])&prefix._M_string_length;
      local_68 = (undefined1  [8])psVar19;
      bVar5 = ConsumeAnyTypeUrl(this,(string *)local_68,(string *)local_b8);
      if (bVar5) {
        psVar19 = &serialized_value._M_string_length;
        prefix.field_2._8_8_ = psVar19;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)((long)&prefix.field_2 + 8),"]","");
        bVar5 = Consume(this,(string *)((long)&prefix.field_2 + 8));
        if ((size_type *)prefix.field_2._8_8_ != psVar19) {
          operator_delete((void *)prefix.field_2._8_8_);
        }
        if (!bVar5) goto LAB_002f0fd5;
        prefix.field_2._8_8_ = psVar19;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)((long)&prefix.field_2 + 8),":","");
        TryConsume(this,(string *)((long)&prefix.field_2 + 8));
        if ((size_type *)prefix.field_2._8_8_ != psVar19) {
          operator_delete((void *)prefix.field_2._8_8_);
        }
        serialized_value._M_dataplus._M_p = (pointer)0x0;
        serialized_value._M_string_length = serialized_value._M_string_length & 0xffffffffffffff00;
        pFVar1 = this->finder_;
        if (pFVar1 == (Finder *)0x0) {
          prefix.field_2._8_8_ = psVar19;
          pDVar11 = anon_unknown_20::DefaultFinderFindAnyType
                              (message,(string *)local_b8,(string *)local_68);
        }
        else {
          prefix.field_2._8_8_ = psVar19;
          iVar7 = (*pFVar1->_vptr_Finder[4])(pFVar1,message,local_b8,local_68);
          pDVar11 = (Descriptor *)CONCAT44(extraout_var_00,iVar7);
        }
        if (pDVar11 == (Descriptor *)0x0) {
          std::operator+(&local_158,"Could not find type \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8);
          plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_68);
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 == paVar16) {
            local_110._M_allocated_capacity = paVar16->_M_allocated_capacity;
            local_110._8_8_ = plVar12[3];
            local_120 = (undefined1  [8])&local_110;
          }
          else {
            local_110._M_allocated_capacity = paVar16->_M_allocated_capacity;
            local_120 = (undefined1  [8])*plVar12;
          }
          _field_number = plVar12[1];
          *plVar12 = (long)paVar16;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append(local_120);
          psVar19 = (size_type *)(plVar12 + 2);
          if ((size_type *)*plVar12 == psVar19) {
            local_d0 = *psVar19;
            uStack_c8 = plVar12[3];
            field_name.field_2._8_8_ = &stack0xffffffffffffff30;
          }
          else {
            local_d0 = *psVar19;
            field_name.field_2._8_8_ = (size_type *)*plVar12;
          }
          *plVar12 = (long)psVar19;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      (string *)((long)&field_name.field_2 + 8));
          if ((undefined8 *)field_name.field_2._8_8_ != &stack0xffffffffffffff30) {
            operator_delete((void *)field_name.field_2._8_8_);
          }
          if (local_120 != (undefined1  [8])&local_110) {
            operator_delete((void *)local_120);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
LAB_002f1bbc:
            operator_delete(local_158._M_dataplus._M_p);
          }
LAB_002f1bc1:
          bVar5 = false;
        }
        else {
          bVar5 = ConsumeAnyValue(this,pDVar11,(string *)((long)&prefix.field_2 + 8));
          if (!bVar5) goto LAB_002f1bc1;
          if ((this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) &&
             (((*(int *)(local_138 + 0x3c) != 3 &&
               (bVar5 = Reflection::HasField(this_01,message,local_138), bVar5)) ||
              ((*(int *)(any_type_url_field + 0x3c) != 3 &&
               (bVar5 = Reflection::HasField(this_01,message,any_type_url_field), bVar5)))))) {
            field_name.field_2._8_8_ = &stack0xffffffffffffff30;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)((long)&field_name.field_2 + 8),
                       "Non-repeated Any specified multiple times.","");
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        (string *)((long)&field_name.field_2 + 8));
            local_158._M_dataplus._M_p = (pointer)field_name.field_2._8_8_;
            if ((undefined8 *)field_name.field_2._8_8_ != &stack0xffffffffffffff30)
            goto LAB_002f1bbc;
            goto LAB_002f1bc1;
          }
          std::operator+(&local_198,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_68);
          Reflection::SetString(this_01,message,local_138,&local_198);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p);
          }
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_178,prefix.field_2._8_8_,
                     serialized_value._M_dataplus._M_p + prefix.field_2._8_8_);
          Reflection::SetString(this_01,message,any_type_url_field,&local_178);
          bVar5 = true;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p);
          }
        }
        if ((size_type *)prefix.field_2._8_8_ != &serialized_value._M_string_length) {
          operator_delete((void *)prefix.field_2._8_8_);
        }
      }
      else {
LAB_002f0fd5:
        bVar5 = false;
      }
      if (local_b8 != (undefined1  [8])&prefix._M_string_length) {
        operator_delete((void *)local_b8);
      }
      if (local_68 != (undefined1  [8])&full_type_name._M_string_length) {
        operator_delete((void *)local_68);
      }
      goto LAB_002f21b5;
    }
  }
  local_68 = (undefined1  [8])psVar19;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"[","");
  bVar5 = TryConsume(this,(string *)local_68);
  if (local_68 != (undefined1  [8])psVar19) {
    operator_delete((void *)local_68);
  }
  if (bVar5) {
    bVar5 = ConsumeFullTypeName(this,(string *)local_100);
    if (bVar5) {
      local_68 = (undefined1  [8])psVar19;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"]","");
      bVar5 = Consume(this,(string *)local_68);
      if (local_68 != (undefined1  [8])psVar19) {
        operator_delete((void *)local_68);
      }
      if (bVar5) {
        pFVar1 = this->finder_;
        if (pFVar1 == (Finder *)0x0) {
          iVar7 = (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
          pFVar14 = DescriptorPool::FindExtensionByPrintableName
                              (*(DescriptorPool **)
                                (*(long *)((Descriptor *)CONCAT44(extraout_var_03,iVar7) + 0x10) +
                                0x10),(Descriptor *)CONCAT44(extraout_var_03,iVar7),
                               (string *)local_100);
        }
        else {
          iVar7 = (*pFVar1->_vptr_Finder[2])(pFVar1,message,local_100);
          pFVar14 = (FieldDescriptor *)CONCAT44(extraout_var_01,iVar7);
        }
        if (pFVar14 != (FieldDescriptor *)0x0) goto LAB_002f1525;
        if ((this->allow_unknown_field_ == false) && (this->allow_unknown_extension_ == false)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_name.field_2 + 8),"Extension \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100);
          plVar12 = (long *)std::__cxx11::string::append(field_name.field_2._M_local_buf + 8);
          prefix.field_2._8_8_ = &serialized_value._M_string_length;
          psVar17 = (size_type *)(plVar12 + 2);
          if ((size_type *)*plVar12 == psVar17) {
            serialized_value._M_string_length = *psVar17;
            serialized_value.field_2._M_allocated_capacity = plVar12[3];
          }
          else {
            serialized_value._M_string_length = *psVar17;
            prefix.field_2._8_8_ = (size_type *)*plVar12;
          }
          serialized_value._M_dataplus._M_p = (pointer)plVar12[1];
          *plVar12 = (long)psVar17;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&prefix.field_2 + 8),
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (serialized_value.field_2._8_8_ + 8));
          plVar12 = (long *)std::__cxx11::string::append(local_b8);
          psVar17 = (size_type *)(plVar12 + 2);
          if ((size_type *)*plVar12 == psVar17) {
            full_type_name._M_string_length = *psVar17;
            full_type_name.field_2._M_allocated_capacity = plVar12[3];
            local_68 = (undefined1  [8])psVar19;
          }
          else {
            full_type_name._M_string_length = *psVar17;
            local_68 = (undefined1  [8])*plVar12;
          }
          full_type_name._M_dataplus._M_p = (pointer)plVar12[1];
          *plVar12 = (long)psVar17;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      (string *)local_68);
          goto LAB_002f2169;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_name.field_2 + 8),"Ignoring extension \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_100);
        plVar12 = (long *)std::__cxx11::string::append(field_name.field_2._M_local_buf + 8);
        prefix.field_2._8_8_ = &serialized_value._M_string_length;
        psVar17 = (size_type *)(plVar12 + 2);
        if ((size_type *)*plVar12 == psVar17) {
          serialized_value._M_string_length = *psVar17;
          serialized_value.field_2._M_allocated_capacity = plVar12[3];
        }
        else {
          serialized_value._M_string_length = *psVar17;
          prefix.field_2._8_8_ = (size_type *)*plVar12;
        }
        serialized_value._M_dataplus._M_p = (pointer)plVar12[1];
        *plVar12 = (long)psVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&prefix.field_2 + 8),
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (serialized_value.field_2._8_8_ + 8));
        plVar12 = (long *)std::__cxx11::string::append(local_b8);
        psVar17 = (size_type *)(plVar12 + 2);
        if ((size_type *)*plVar12 == psVar17) {
          full_type_name._M_string_length = *psVar17;
          full_type_name.field_2._M_allocated_capacity = plVar12[3];
          local_68 = (undefined1  [8])psVar19;
        }
        else {
          full_type_name._M_string_length = *psVar17;
          local_68 = (undefined1  [8])*plVar12;
        }
        full_type_name._M_dataplus._M_p = (pointer)plVar12[1];
        *plVar12 = (long)psVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      (string *)local_68);
LAB_002f1d3a:
        if (local_68 != (undefined1  [8])&full_type_name._M_string_length) {
          operator_delete((void *)local_68);
        }
        if (local_b8 != (undefined1  [8])&prefix._M_string_length) {
          operator_delete((void *)local_b8);
        }
        if ((size_type *)prefix.field_2._8_8_ != &serialized_value._M_string_length) {
          operator_delete((void *)prefix.field_2._8_8_);
        }
        if ((undefined8 *)field_name.field_2._8_8_ != &stack0xffffffffffffff30) {
          operator_delete((void *)field_name.field_2._8_8_);
        }
        bVar6 = false;
LAB_002f1d85:
        if (((this->allow_unknown_field_ == false) && (!bVar6)) &&
           ((this->allow_unknown_extension_ & 1U) == 0)) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/text_format.cc"
                     ,0x1fb);
          other = internal::LogMessage::operator<<
                            ((LogMessage *)local_68,
                             "CHECK failed: allow_unknown_field_ || allow_unknown_extension_ || reserved_field: "
                            );
          internal::LogFinisher::operator=((LogFinisher *)local_b8,other);
          internal::LogMessage::~LogMessage((LogMessage *)local_68);
        }
        local_68 = (undefined1  [8])&full_type_name._M_string_length;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_68,":","");
        bVar5 = TryConsume(this,(string *)local_68);
        if (bVar5) {
          local_b8 = (undefined1  [8])&prefix._M_string_length;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"{","");
          auVar22 = local_b8;
          pcVar18 = (pointer)(this->tokenizer_).current_.text._M_string_length;
          if ((pcVar18 == prefix._M_dataplus._M_p) &&
             ((pcVar18 == (pointer)0x0 ||
              (iVar7 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,(void *)local_b8,
                            (size_t)pcVar18), iVar7 == 0)))) {
            bVar5 = false;
          }
          else {
            prefix.field_2._8_8_ = &serialized_value._M_string_length;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)((long)&prefix.field_2 + 8),"<","");
            uVar4 = prefix.field_2._8_8_;
            pcVar18 = (pointer)(this->tokenizer_).current_.text._M_string_length;
            if (pcVar18 == serialized_value._M_dataplus._M_p) {
              if (pcVar18 == (pointer)0x0) {
                bVar5 = false;
              }
              else {
                iVar7 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,
                             (void *)prefix.field_2._8_8_,(size_t)pcVar18);
                bVar5 = iVar7 != 0;
              }
            }
            else {
              bVar5 = true;
            }
            auVar22 = local_b8;
            if ((size_type *)uVar4 != &serialized_value._M_string_length) {
              operator_delete((void *)uVar4);
              auVar22 = local_b8;
            }
          }
          if (auVar22 != (undefined1  [8])&prefix._M_string_length) {
            operator_delete((void *)auVar22);
          }
        }
        else {
          bVar5 = false;
        }
        if (local_68 != (undefined1  [8])&full_type_name._M_string_length) {
          operator_delete((void *)local_68);
        }
        if (bVar5) {
          bVar5 = SkipFieldValue(this);
        }
        else {
          bVar5 = SkipFieldMessage(this);
        }
        goto LAB_002f21b5;
      }
    }
LAB_002f21b2:
    bVar5 = false;
  }
  else {
    bVar5 = ConsumeIdentifier(this,(string *)local_100);
    if (!bVar5) goto LAB_002f21b2;
    if ((this->allow_field_number_ == true) &&
       (bVar5 = safe_strto32((string *)local_100,(int32 *)local_120), bVar5)) {
      pEVar9 = Descriptor::FindExtensionRangeContainingNumber
                         ((Descriptor *)serialized_value.field_2._8_8_,local_120._0_4_);
      if (pEVar9 == (ExtensionRange *)0x0) {
        pRVar13 = Descriptor::FindReservedRangeContainingNumber
                            ((Descriptor *)serialized_value.field_2._8_8_,local_120._0_4_);
        bVar6 = true;
        if (pRVar13 == (ReservedRange *)0x0) {
          pFVar14 = Descriptor::FindFieldByNumber
                              ((Descriptor *)serialized_value.field_2._8_8_,local_120._0_4_);
          goto LAB_002f1519;
        }
        goto LAB_002f1d85;
      }
      pFVar1 = this->finder_;
      if (pFVar1 == (Finder *)0x0) {
        pFVar14 = DescriptorPool::FindExtensionByNumber
                            (*(DescriptorPool **)
                              (*(long *)(serialized_value.field_2._8_8_ + 0x10) + 0x10),
                             (Descriptor *)serialized_value.field_2._8_8_,local_120._0_4_);
      }
      else {
        iVar7 = (*pFVar1->_vptr_Finder[3])(pFVar1,serialized_value.field_2._8_8_);
        pFVar14 = (FieldDescriptor *)CONCAT44(extraout_var_02,iVar7);
      }
LAB_002f1519:
      if (pFVar14 != (FieldDescriptor *)0x0) goto LAB_002f1525;
LAB_002f191c:
      if (this->allow_unknown_field_ != false) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_name.field_2 + 8),"Message type \"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (serialized_value.field_2._8_8_ + 8));
        plVar12 = (long *)std::__cxx11::string::append(field_name.field_2._M_local_buf + 8);
        prefix.field_2._8_8_ = &serialized_value._M_string_length;
        psVar19 = (size_type *)(plVar12 + 2);
        if ((size_type *)*plVar12 == psVar19) {
          serialized_value._M_string_length = *psVar19;
          serialized_value.field_2._M_allocated_capacity = plVar12[3];
        }
        else {
          serialized_value._M_string_length = *psVar19;
          prefix.field_2._8_8_ = (size_type *)*plVar12;
        }
        serialized_value._M_dataplus._M_p = (pointer)plVar12[1];
        *plVar12 = (long)psVar19;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&prefix.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_100);
        plVar12 = (long *)std::__cxx11::string::append(local_b8);
        psVar19 = (size_type *)(plVar12 + 2);
        if ((size_type *)*plVar12 == psVar19) {
          full_type_name._M_string_length = *psVar19;
          full_type_name.field_2._M_allocated_capacity = plVar12[3];
          local_68 = (undefined1  [8])&full_type_name._M_string_length;
        }
        else {
          full_type_name._M_string_length = *psVar19;
          local_68 = (undefined1  [8])*plVar12;
        }
        full_type_name._M_dataplus._M_p = (pointer)plVar12[1];
        *plVar12 = (long)psVar19;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      (string *)local_68);
        goto LAB_002f1d3a;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_name.field_2 + 8),"Message type \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (serialized_value.field_2._8_8_ + 8));
      plVar12 = (long *)std::__cxx11::string::append(field_name.field_2._M_local_buf + 8);
      prefix.field_2._8_8_ = &serialized_value._M_string_length;
      psVar19 = (size_type *)(plVar12 + 2);
      if ((size_type *)*plVar12 == psVar19) {
        serialized_value._M_string_length = *psVar19;
        serialized_value.field_2._M_allocated_capacity = plVar12[3];
      }
      else {
        serialized_value._M_string_length = *psVar19;
        prefix.field_2._8_8_ = (size_type *)*plVar12;
      }
      serialized_value._M_dataplus._M_p = (pointer)plVar12[1];
      *plVar12 = (long)psVar19;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&prefix.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100)
      ;
      plVar12 = (long *)std::__cxx11::string::append(local_b8);
      psVar19 = (size_type *)(plVar12 + 2);
      if ((size_type *)*plVar12 == psVar19) {
        full_type_name._M_string_length = *psVar19;
        full_type_name.field_2._M_allocated_capacity = plVar12[3];
        local_68 = (undefined1  [8])&full_type_name._M_string_length;
      }
      else {
        full_type_name._M_string_length = *psVar19;
        local_68 = (undefined1  [8])*plVar12;
      }
      full_type_name._M_dataplus._M_p = (pointer)plVar12[1];
      *plVar12 = (long)psVar19;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                  (string *)local_68);
LAB_002f2169:
      if (local_68 != (undefined1  [8])&full_type_name._M_string_length) {
        operator_delete((void *)local_68);
      }
      if (local_b8 != (undefined1  [8])&prefix._M_string_length) {
        operator_delete((void *)local_b8);
      }
      if ((size_type *)prefix.field_2._8_8_ != &serialized_value._M_string_length) {
        operator_delete((void *)prefix.field_2._8_8_);
      }
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&stack0xffffffffffffff30;
LAB_002f21a4:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar16->_M_allocated_capacity)[-2] != paVar16) {
        operator_delete((undefined1 *)(&paVar16->_M_allocated_capacity)[-2]);
      }
      goto LAB_002f21b2;
    }
    pFVar14 = Descriptor::FindFieldByName
                        ((Descriptor *)serialized_value.field_2._8_8_,(string *)local_100);
    if (pFVar14 == (FieldDescriptor *)0x0) {
      local_68 = (undefined1  [8])psVar19;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_68,local_100,field_name._M_dataplus._M_p + (long)local_100);
      if (full_type_name._M_dataplus._M_p != (pointer)0x0) {
        pcVar18 = (pointer)0x0;
        do {
          if ((byte)(*(byte *)((long)local_68 + (long)pcVar18) + 0xbf) < 0x1a) {
            *(byte *)((long)local_68 + (long)pcVar18) =
                 *(byte *)((long)local_68 + (long)pcVar18) | 0x20;
          }
          pcVar18 = pcVar18 + 1;
        } while (full_type_name._M_dataplus._M_p != pcVar18);
      }
      pFVar10 = Descriptor::FindFieldByName
                          ((Descriptor *)serialized_value.field_2._8_8_,(string *)local_68);
      if (pFVar10 == (FieldDescriptor *)0x0) {
        pFVar14 = (FieldDescriptor *)0x0;
      }
      else {
        if (*(once_flag **)(pFVar10 + 0x30) != (once_flag *)0x0) {
          local_b8 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
          prefix.field_2._8_8_ = pFVar10;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(pFVar10 + 0x30),(_func_void_FieldDescriptor_ptr **)local_b8,
                     (FieldDescriptor **)((long)&prefix.field_2 + 8));
        }
        pFVar14 = (FieldDescriptor *)0x0;
        if (*(int *)(pFVar10 + 0x38) == 10) {
          pFVar14 = pFVar10;
        }
      }
      if (local_68 != (undefined1  [8])psVar19) {
        operator_delete((void *)local_68);
      }
      if (pFVar14 != (FieldDescriptor *)0x0) goto LAB_002f12a8;
LAB_002f1311:
      if (this->allow_case_insensitive_field_ == true) {
        local_68 = (undefined1  [8])psVar19;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_68,local_100,field_name._M_dataplus._M_p + (long)local_100);
        if (full_type_name._M_dataplus._M_p != (pointer)0x0) {
          pcVar18 = (pointer)0x0;
          do {
            if ((byte)(*(byte *)((long)local_68 + (long)pcVar18) + 0xbf) < 0x1a) {
              *(byte *)((long)local_68 + (long)pcVar18) =
                   *(byte *)((long)local_68 + (long)pcVar18) | 0x20;
            }
            pcVar18 = pcVar18 + 1;
          } while (full_type_name._M_dataplus._M_p != pcVar18);
        }
        pFVar14 = Descriptor::FindFieldByLowercaseName
                            ((Descriptor *)serialized_value.field_2._8_8_,(string *)local_68);
        if (local_68 != (undefined1  [8])psVar19) {
          operator_delete((void *)local_68);
        }
        if (pFVar14 != (FieldDescriptor *)0x0) goto LAB_002f1525;
      }
      __n._M_p = field_name._M_dataplus._M_p;
      auVar22 = local_100;
      uVar21 = (ulong)*(int *)(serialized_value.field_2._8_8_ + 0x88);
      if (0 < (long)uVar21) {
        lVar2 = *(long *)(serialized_value.field_2._8_8_ + 0x60);
        pFVar14 = (FieldDescriptor *)-uVar21;
        bVar5 = true;
        uVar20 = 1;
        any_value_field = pFVar14;
        local_c0 = this;
        do {
          puVar15 = *(undefined8 **)(lVar2 + -8 + uVar20 * 8);
          if ((__n._M_p == (pointer)puVar15[1]) &&
             ((__n._M_p == (pointer)0x0 ||
              (iVar7 = bcmp((void *)auVar22,(void *)*puVar15,(size_t)__n._M_p),
              pFVar14 = any_value_field, iVar7 == 0)))) break;
          bVar5 = uVar20 < uVar21;
          pFVar10 = pFVar14 + uVar20;
          uVar20 = uVar20 + 1;
        } while (pFVar10 != (FieldDescriptor *)0x0);
        bVar6 = true;
        this = local_c0;
        if (bVar5) goto LAB_002f1d85;
      }
      goto LAB_002f191c;
    }
LAB_002f12a8:
    if (*(once_flag **)(pFVar14 + 0x30) != (once_flag *)0x0) {
      local_68 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
      local_b8 = (undefined1  [8])pFVar14;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar14 + 0x30),(_func_void_FieldDescriptor_ptr **)local_68,
                 (FieldDescriptor **)local_b8);
    }
    if (*(int *)(pFVar14 + 0x38) == 10) {
      pDVar11 = FieldDescriptor::message_type(pFVar14);
      pcVar18 = (pointer)(*(undefined8 **)pDVar11)[1];
      if ((pcVar18 != field_name._M_dataplus._M_p) ||
         ((pcVar18 != (pointer)0x0 &&
          (iVar7 = bcmp((void *)**(undefined8 **)pDVar11,(void *)local_100,(size_t)pcVar18),
          iVar7 != 0)))) goto LAB_002f1311;
    }
LAB_002f1525:
    if (this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      if (*(int *)(pFVar14 + 0x3c) != 3) {
        bVar5 = Reflection::HasField(this_01,message,pFVar14);
        if (bVar5) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8,"Non-repeated field \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100);
          plVar12 = (long *)std::__cxx11::string::append(local_b8);
          psVar19 = (size_type *)(plVar12 + 2);
          if ((size_type *)*plVar12 == psVar19) {
            full_type_name._M_string_length = *psVar19;
            full_type_name.field_2._M_allocated_capacity = plVar12[3];
            local_68 = (undefined1  [8])&full_type_name._M_string_length;
          }
          else {
            full_type_name._M_string_length = *psVar19;
            local_68 = (undefined1  [8])*plVar12;
          }
          full_type_name._M_dataplus._M_p = (pointer)plVar12[1];
          *plVar12 = (long)psVar19;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      (string *)local_68);
          if (local_68 != (undefined1  [8])&full_type_name._M_string_length) {
            operator_delete((void *)local_68);
          }
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&prefix._M_string_length;
          goto LAB_002f21a4;
        }
      }
      oneof_descriptor = *(OneofDescriptor **)(pFVar14 + 0x58);
      if ((oneof_descriptor != (OneofDescriptor *)0x0) &&
         (bVar5 = Reflection::HasOneof(this_01,message,oneof_descriptor), bVar5)) {
        pFVar14 = Reflection::GetOneofFieldDescriptor(this_01,message,oneof_descriptor);
        std::operator+(&local_158,"Field \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_100);
        puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar15 == paVar16) {
          local_110._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_110._8_8_ = puVar15[3];
          local_120 = (undefined1  [8])&local_110;
        }
        else {
          local_110._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_120 = (undefined1  [8])*puVar15;
        }
        _field_number = puVar15[1];
        *puVar15 = paVar16;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_name.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_120,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        pFVar14);
        plVar12 = (long *)std::__cxx11::string::append(field_name.field_2._M_local_buf + 8);
        psVar19 = (size_type *)(plVar12 + 2);
        if ((size_type *)*plVar12 == psVar19) {
          serialized_value._M_string_length = *psVar19;
          serialized_value.field_2._M_allocated_capacity = plVar12[3];
          prefix.field_2._8_8_ = &serialized_value._M_string_length;
        }
        else {
          serialized_value._M_string_length = *psVar19;
          prefix.field_2._8_8_ = (size_type *)*plVar12;
        }
        serialized_value._M_dataplus._M_p = (pointer)plVar12[1];
        *plVar12 = (long)psVar19;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&prefix.field_2 + 8),
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        oneof_descriptor);
        plVar12 = (long *)std::__cxx11::string::append(local_b8);
        local_68 = (undefined1  [8])&full_type_name._M_string_length;
        psVar19 = (size_type *)(plVar12 + 2);
        if ((size_type *)*plVar12 == psVar19) {
          full_type_name._M_string_length = *psVar19;
          full_type_name.field_2._M_allocated_capacity = plVar12[3];
        }
        else {
          full_type_name._M_string_length = *psVar19;
          local_68 = (undefined1  [8])*plVar12;
        }
        full_type_name._M_dataplus._M_p = (pointer)plVar12[1];
        *plVar12 = (long)psVar19;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    (string *)local_68);
        if (local_68 != (undefined1  [8])&full_type_name._M_string_length) {
          operator_delete((void *)local_68);
        }
        if (local_b8 != (undefined1  [8])&prefix._M_string_length) {
          operator_delete((void *)local_b8);
        }
        if ((size_type *)prefix.field_2._8_8_ != &serialized_value._M_string_length) {
          operator_delete((void *)prefix.field_2._8_8_);
        }
        if ((undefined8 *)field_name.field_2._8_8_ != &stack0xffffffffffffff30) {
          operator_delete((void *)field_name.field_2._8_8_);
        }
        if (local_120 != (undefined1  [8])&local_110) {
          operator_delete((void *)local_120);
        }
        paVar16 = &local_158.field_2;
        goto LAB_002f21a4;
      }
    }
    if (*(once_flag **)(pFVar14 + 0x30) != (once_flag *)0x0) {
      local_68 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
      local_b8 = (undefined1  [8])pFVar14;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar14 + 0x30),(_func_void_FieldDescriptor_ptr **)local_68,
                 (FieldDescriptor **)local_b8);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(pFVar14 + 0x38) * 4) == 10) {
      psVar19 = &full_type_name._M_string_length;
      local_68 = (undefined1  [8])psVar19;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,":","");
      bVar5 = TryConsume(this,(string *)local_68);
      if (local_68 != (undefined1  [8])psVar19) {
        operator_delete((void *)local_68);
      }
      if (((!bVar5) || (*(char *)(*(long *)(pFVar14 + 0x78) + 0x4f) != '\x01')) ||
         ((this->tokenizer_).current_.type != TYPE_STRING)) goto LAB_002f1757;
      full_type_name._M_dataplus._M_p = (pointer)0x0;
      full_type_name._M_string_length = full_type_name._M_string_length & 0xffffffffffffff00;
      local_68 = (undefined1  [8])psVar19;
      bVar5 = ConsumeString(this,(string *)local_68);
      if (bVar5) {
        pFVar1 = this->finder_;
        if (pFVar1 == (Finder *)0x0) {
          factory = (MessageFactory *)0x0;
        }
        else {
          iVar7 = (*pFVar1->_vptr_Finder[5])(pFVar1,pFVar14);
          factory = (MessageFactory *)CONCAT44(extraout_var_04,iVar7);
        }
        this_00 = &Reflection::MutableMessage(this_01,message,pFVar14,factory)->super_MessageLite;
        MessageLite::ParseFromString(this_00,(string *)local_68);
      }
      local_c0 = this;
      if (local_68 != (undefined1  [8])psVar19) {
        operator_delete((void *)local_68);
      }
      if (!bVar5) goto LAB_002f21b2;
    }
    else {
      local_68 = (undefined1  [8])&full_type_name._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,":","");
      bVar5 = Consume(this,(string *)local_68);
      if (local_68 != (undefined1  [8])&full_type_name._M_string_length) {
        operator_delete((void *)local_68);
      }
      if (!bVar5) goto LAB_002f21b2;
LAB_002f1757:
      psVar19 = &full_type_name._M_string_length;
      local_c0 = this;
      if (*(int *)(pFVar14 + 0x3c) == 3) {
        local_68 = (undefined1  [8])psVar19;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"[","");
        bVar5 = TryConsume(this,(string *)local_68);
        if (local_68 != (undefined1  [8])psVar19) {
          operator_delete((void *)local_68);
        }
        if (bVar5) {
          local_68 = (undefined1  [8])psVar19;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"]","");
          bVar5 = TryConsume(this,(string *)local_68);
          if (local_68 != (undefined1  [8])psVar19) {
            operator_delete((void *)local_68);
          }
          if (!bVar5) {
            do {
              pPVar3 = local_c0;
              psVar19 = &full_type_name._M_string_length;
              if (*(once_flag **)(pFVar14 + 0x30) != (once_flag *)0x0) {
                local_68 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
                local_b8 = (undefined1  [8])pFVar14;
                std::
                call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                          (*(once_flag **)(pFVar14 + 0x30),
                           (_func_void_FieldDescriptor_ptr **)local_68,(FieldDescriptor **)local_b8)
                ;
              }
              if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(pFVar14 + 0x38) * 4
                          ) == 10) {
                bVar5 = ConsumeFieldMessage(pPVar3,message,this_01,pFVar14);
              }
              else {
                bVar5 = ConsumeFieldValue(pPVar3,message,this_01,pFVar14);
              }
              if (bVar5 == false) goto LAB_002f21b2;
              local_68 = (undefined1  [8])psVar19;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"]","");
              bVar5 = TryConsume(pPVar3,(string *)local_68);
              if (local_68 != (undefined1  [8])psVar19) {
                operator_delete((void *)local_68);
              }
              if (bVar5) goto LAB_002f2219;
              local_68 = (undefined1  [8])psVar19;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_68,",","");
              bVar6 = Consume(local_c0,(string *)local_68);
              if (local_68 != (undefined1  [8])psVar19) {
                operator_delete((void *)local_68);
              }
              bVar5 = false;
            } while (bVar6);
            goto LAB_002f21b5;
          }
          goto LAB_002f2219;
        }
      }
      CVar8 = FieldDescriptor::cpp_type(pFVar14);
      if (CVar8 == CPPTYPE_MESSAGE) {
        bVar5 = ConsumeFieldMessage(this,message,this_01,pFVar14);
      }
      else {
        bVar5 = ConsumeFieldValue(this,message,this_01,pFVar14);
      }
      if (bVar5 == false) goto LAB_002f21b2;
    }
LAB_002f2219:
    psVar19 = &full_type_name._M_string_length;
    local_68 = (undefined1  [8])psVar19;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,";","");
    pPVar3 = local_c0;
    bVar5 = TryConsume(local_c0,(string *)local_68);
    if (!bVar5) {
      local_b8 = (undefined1  [8])&prefix._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,",","");
      TryConsume(pPVar3,(string *)local_b8);
      if (local_b8 != (undefined1  [8])&prefix._M_string_length) {
        operator_delete((void *)local_b8);
      }
    }
    if (local_68 != (undefined1  [8])psVar19) {
      operator_delete((void *)local_68);
    }
    if (*(char *)(*(long *)(pFVar14 + 0x78) + 0x4e) == '\x01') {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     "text format contains deprecated field \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100)
      ;
      plVar12 = (long *)std::__cxx11::string::append(local_b8);
      psVar17 = (size_type *)(plVar12 + 2);
      if ((size_type *)*plVar12 == psVar17) {
        full_type_name._M_string_length = *psVar17;
        full_type_name.field_2._M_allocated_capacity = plVar12[3];
        local_68 = (undefined1  [8])psVar19;
      }
      else {
        full_type_name._M_string_length = *psVar17;
        local_68 = (undefined1  [8])*plVar12;
      }
      full_type_name._M_dataplus._M_p = (pointer)plVar12[1];
      *plVar12 = (long)psVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      ReportWarning(pPVar3,(pPVar3->tokenizer_).current_.line,(pPVar3->tokenizer_).current_.column,
                    (string *)local_68);
      if (local_68 != (undefined1  [8])psVar19) {
        operator_delete((void *)local_68);
      }
      if (local_b8 != (undefined1  [8])&prefix._M_string_length) {
        operator_delete((void *)local_b8);
      }
    }
    bVar5 = true;
    if (pPVar3->parse_info_tree_ != (ParseInfoTree *)0x0) {
      ParseInfoTree::RecordLocation(pPVar3->parse_info_tree_,pFVar14,(ParseLocation)any_value_field)
      ;
    }
  }
LAB_002f21b5:
  if (local_100 != (undefined1  [8])&field_name._M_string_length) {
    operator_delete((void *)local_100);
  }
  return bVar5;
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    std::string field_name;
    bool reserved_field = false;
    const FieldDescriptor* field = nullptr;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    const FieldDescriptor* any_type_url_field;
    const FieldDescriptor* any_value_field;
    if (internal::GetAnyFieldDescriptors(*message, &any_type_url_field,
                                         &any_value_field) &&
        TryConsume("[")) {
      std::string full_type_name, prefix;
      DO(ConsumeAnyTypeUrl(&full_type_name, &prefix));
      DO(Consume("]"));
      TryConsume(":");  // ':' is optional between message labels and values.
      std::string serialized_value;
      const Descriptor* value_descriptor =
          finder_ ? finder_->FindAnyType(*message, prefix, full_type_name)
                  : DefaultFinderFindAnyType(*message, prefix, full_type_name);
      if (value_descriptor == nullptr) {
        ReportError("Could not find type \"" + prefix + full_type_name +
                    "\" stored in google.protobuf.Any.");
        return false;
      }
      DO(ConsumeAnyValue(value_descriptor, &serialized_value));
      if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        // Fail if any_type_url_field has already been specified.
        if ((!any_type_url_field->is_repeated() &&
             reflection->HasField(*message, any_type_url_field)) ||
            (!any_value_field->is_repeated() &&
             reflection->HasField(*message, any_value_field))) {
          ReportError("Non-repeated Any specified multiple times.");
          return false;
        }
      }
      reflection->SetString(message, any_type_url_field,
                            std::string(prefix + full_type_name));
      reflection->SetString(message, any_value_field, serialized_value);
      return true;
    }
    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeFullTypeName(&field_name));
      DO(Consume("]"));

      field = finder_ ? finder_->FindExtension(message, field_name)
                      : DefaultFinderFindExtension(message, field_name);

      if (field == nullptr) {
        if (!allow_unknown_field_ && !allow_unknown_extension_) {
          ReportError("Extension \"" + field_name +
                      "\" is not defined or "
                      "is not an extension of \"" +
                      descriptor->full_name() + "\".");
          return false;
        } else {
          ReportWarning("Ignoring extension \"" + field_name +
                        "\" which is not defined or is not an extension of \"" +
                        descriptor->full_name() + "\".");
        }
      }
    } else {
      DO(ConsumeIdentifier(&field_name));

      int32 field_number;
      if (allow_field_number_ &&
          safe_strto32(field_name, &field_number)) {
        if (descriptor->IsExtensionNumber(field_number)) {
          field = finder_
                      ? finder_->FindExtensionByNumber(descriptor, field_number)
                      : DefaultFinderFindExtensionByNumber(descriptor,
                                                           field_number);
        } else if (descriptor->IsReservedNumber(field_number)) {
          reserved_field = true;
        } else {
          field = descriptor->FindFieldByNumber(field_number);
        }
      } else {
        field = descriptor->FindFieldByName(field_name);
        // Group names are expected to be capitalized as they appear in the
        // .proto file, which actually matches their type names, not their
        // field names.
        if (field == nullptr) {
          std::string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByName(lower_field_name);
          // If the case-insensitive match worked but the field is NOT a group,
          if (field != nullptr &&
              field->type() != FieldDescriptor::TYPE_GROUP) {
            field = nullptr;
          }
        }
        // Again, special-case group names as described above.
        if (field != nullptr && field->type() == FieldDescriptor::TYPE_GROUP &&
            field->message_type()->name() != field_name) {
          field = nullptr;
        }

        if (field == nullptr && allow_case_insensitive_field_) {
          std::string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByLowercaseName(lower_field_name);
        }

        if (field == nullptr) {
          reserved_field = descriptor->IsReservedName(field_name);
        }
      }

      if (field == nullptr && !reserved_field) {
        if (!allow_unknown_field_) {
          ReportError("Message type \"" + descriptor->full_name() +
                      "\" has no field named \"" + field_name + "\".");
          return false;
        } else {
          ReportWarning("Message type \"" + descriptor->full_name() +
                        "\" has no field named \"" + field_name + "\".");
        }
      }
    }

    // Skips unknown or reserved fields.
    if (field == nullptr) {
      GOOGLE_CHECK(allow_unknown_field_ || allow_unknown_extension_ || reserved_field);

      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the beginning of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsume(":") && !LookingAt("{") && !LookingAt("<")) {
        return SkipFieldValue();
      } else {
        return SkipFieldMessage();
      }
    }

    if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      // Fail if the field is not repeated and it has already been specified.
      if (!field->is_repeated() && reflection->HasField(*message, field)) {
        ReportError("Non-repeated field \"" + field_name +
                    "\" is specified multiple times.");
        return false;
      }
      // Fail if the field is a member of a oneof and another member has already
      // been specified.
      const OneofDescriptor* oneof = field->containing_oneof();
      if (oneof != nullptr && reflection->HasOneof(*message, oneof)) {
        const FieldDescriptor* other_field =
            reflection->GetOneofFieldDescriptor(*message, oneof);
        ReportError("Field \"" + field_name +
                    "\" is specified along with "
                    "field \"" +
                    other_field->name() +
                    "\", another member "
                    "of oneof \"" +
                    oneof->name() + "\".");
        return false;
      }
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      bool consumed_semicolon = TryConsume(":");
      if (consumed_semicolon && field->options().weak() &&
          LookingAtType(io::Tokenizer::TYPE_STRING)) {
        // we are getting a bytes string for a weak field.
        std::string tmp;
        DO(ConsumeString(&tmp));
        MessageFactory* factory =
            finder_ ? finder_->FindExtensionFactory(field) : nullptr;
        reflection->MutableMessage(message, field, factory)
            ->ParseFromString(tmp);
        goto label_skip_parsing;
      }
    } else {
      // ':' is required here.
      DO(Consume(":"));
    }

    if (field->is_repeated() && TryConsume("[")) {
      // Short repeated format, e.g.  "foo: [1, 2, 3]".
      if (!TryConsume("]")) {
        // "foo: []" is treated as empty.
        while (true) {
          if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            // Perform special handling for embedded message types.
            DO(ConsumeFieldMessage(message, reflection, field));
          } else {
            DO(ConsumeFieldValue(message, reflection, field));
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(ConsumeFieldValue(message, reflection, field));
    }
  label_skip_parsing:
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");

    if (field->options().deprecated()) {
      ReportWarning("text format contains deprecated field \"" + field_name +
                    "\"");
    }

    // If a parse info tree exists, add the location for the parsed
    // field.
    if (parse_info_tree_ != nullptr) {
      RecordLocation(parse_info_tree_, field,
                     ParseLocation(start_line, start_column));
    }

    return true;
  }